

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

int SUNMatMatvec_Sparse(SUNMatrix A,N_Vector x,N_Vector y)

{
  void *pvVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  bool bVar6;
  SUNMatrix_ID SVar7;
  sunindextype sVar8;
  int iVar9;
  realtype *prVar10;
  realtype *prVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  sunindextype *Aj;
  realtype *Ax;
  realtype rVar16;
  
  iVar9 = -0x2bd;
  if ((x->ops->nvgetarraypointer != (_func_realtype_ptr_N_Vector *)0x0) &&
     (y->ops->nvgetarraypointer != (_func_realtype_ptr_N_Vector *)0x0)) {
    SVar7 = SUNMatGetID(A);
    iVar9 = -0x2bd;
    iVar15 = -0x2bd;
    if (SVar7 == SUNMATRIX_SPARSE) {
      iVar15 = *(int *)((long)A->content + 4);
    }
    sVar8 = N_VGetLength(x);
    if (iVar15 == sVar8) {
      SVar7 = SUNMatGetID(A);
      iVar9 = -0x2bd;
      iVar15 = -0x2bd;
      if (SVar7 == SUNMATRIX_SPARSE) {
        iVar15 = *A->content;
      }
      sVar8 = N_VGetLength(y);
      if (iVar15 == sVar8) {
        pvVar1 = A->content;
        piVar2 = *(int **)((long)pvVar1 + 0x28);
        lVar3 = *(long *)((long)pvVar1 + 0x10);
        lVar4 = *(long *)((long)pvVar1 + 0x20);
        bVar6 = lVar3 == 0 || (lVar4 == 0 || piVar2 == (int *)0x0);
        if (*(int *)((long)pvVar1 + 0x18) == 0) {
          if (bVar6) {
            return -0x2be;
          }
          prVar10 = N_VGetArrayPointer(x);
          prVar11 = N_VGetArrayPointer(y);
          if (prVar10 == prVar11 || (prVar11 == (realtype *)0x0 || prVar10 == (realtype *)0x0)) {
            return -0x2be;
          }
          piVar5 = (int *)A->content;
          lVar12 = (long)*piVar5;
          if (0 < lVar12) {
            memset(prVar11,0,lVar12 << 3);
          }
          lVar12 = (long)piVar5[1];
          if (0 < lVar12) {
            lVar14 = 0;
            iVar9 = *piVar2;
            do {
              iVar15 = piVar2[lVar14 + 1];
              if (iVar9 < iVar15) {
                lVar13 = (long)iVar9;
                do {
                  iVar9 = *(int *)(lVar4 + lVar13 * 4);
                  prVar11[iVar9] =
                       *(double *)(lVar3 + lVar13 * 8) * prVar10[lVar14] + prVar11[iVar9];
                  lVar13 = lVar13 + 1;
                } while (iVar15 != lVar13);
              }
              lVar14 = lVar14 + 1;
              iVar9 = iVar15;
            } while (lVar14 != lVar12);
            return 0;
          }
        }
        else {
          if (bVar6) {
            return -0x2be;
          }
          prVar10 = N_VGetArrayPointer(x);
          prVar11 = N_VGetArrayPointer(y);
          if (prVar10 == prVar11 || (prVar11 == (realtype *)0x0 || prVar10 == (realtype *)0x0)) {
            return -0x2be;
          }
          lVar12 = (long)*A->content;
          if (0 < lVar12) {
            lVar14 = 0;
            memset(prVar11,0,lVar12 * 8);
            iVar9 = *piVar2;
            do {
              iVar15 = piVar2[lVar14 + 1];
              if (iVar9 < iVar15) {
                rVar16 = prVar11[lVar14];
                lVar13 = (long)iVar9;
                do {
                  rVar16 = rVar16 + *(double *)(lVar3 + lVar13 * 8) *
                                    prVar10[*(int *)(lVar4 + lVar13 * 4)];
                  prVar11[lVar14] = rVar16;
                  lVar13 = lVar13 + 1;
                } while (iVar15 != lVar13);
              }
              lVar14 = lVar14 + 1;
              iVar9 = iVar15;
            } while (lVar14 != lVar12);
            return 0;
          }
        }
        iVar9 = 0;
      }
    }
  }
  return iVar9;
}

Assistant:

static booleantype SMCompatible2_Sparse(SUNMatrix A, N_Vector x, N_Vector y)
{
  /* vectors must implement N_VGetArrayPointer */
  if ( (x->ops->nvgetarraypointer == NULL) ||
       (y->ops->nvgetarraypointer == NULL) )
    return SUNFALSE;

  /* Verify that the dimensions of A, x, and y agree */
  if ( (SUNSparseMatrix_Columns(A) != N_VGetLength(x)) ||
       (SUNSparseMatrix_Rows(A) != N_VGetLength(y)) )
    return SUNFALSE;

  return SUNTRUE;
}